

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O1

string * encodeCompactNodeId_abi_cxx11_(string *__return_storage_ptr__,bdId *id)

{
  long lVar1;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = 0x10;
  do {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x24);
  encodeCompactPeerId_abi_cxx11_(&local_40,&id->addr);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encodeCompactNodeId(bdId *id) {
	std::string enc;
	for (int i = 0; i < BITDHT_KEY_LEN; i++) {
		enc += id->id.data[i];
	}
	/* convert ip address (already in network order) */
	enc += encodeCompactPeerId(&(id->addr));
	return enc;
}